

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend-reg.cpp
# Opt level: O1

ggml_backend_dev_t ggml_backend_dev_get(size_t index)

{
  bool bVar1;
  ggml_backend_dev_t pgVar2;
  char *a;
  char *b;
  size_t index_00;
  
  get_reg();
  if (index < (ulong)((long)get_reg::reg.devices.
                            super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)get_reg::reg.devices.
                            super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3)) {
    get_reg();
    return get_reg::reg.devices.
           super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>._M_impl
           .super__Vector_impl_data._M_start[index];
  }
  b = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-backend-reg.cpp";
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-backend-reg.cpp"
             ,0x15c,"GGML_ASSERT(%s) failed","index < ggml_backend_dev_count()");
  get_reg();
  if (get_reg::reg.devices.
      super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      get_reg::reg.devices.
      super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    index_00 = 0;
    do {
      pgVar2 = ggml_backend_dev_get(index_00);
      a = (char *)ggml_backend_dev_name(pgVar2);
      bVar1 = striequals(a,b);
      if (bVar1) {
        return pgVar2;
      }
      index_00 = index_00 + 1;
      get_reg();
    } while (index_00 <
             (ulong)((long)get_reg::reg.devices.
                           super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)get_reg::reg.devices.
                           super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return (ggml_backend_dev_t)0x0;
}

Assistant:

ggml_backend_dev_t ggml_backend_dev_get(size_t index) {
    GGML_ASSERT(index < ggml_backend_dev_count());
    return get_reg().devices[index];
}